

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.h
# Opt level: O1

void __thiscall
slang::ast::CallExpression::visitExprs<slang::analysis::SampledValueFuncVisitor&>
          (CallExpression *this,SampledValueFuncVisitor *visitor)

{
  size_t sVar1;
  pointer ppEVar2;
  Expression *this_00;
  long lVar3;
  
  visitExprsNoArgs<slang::analysis::SampledValueFuncVisitor&>(this,visitor);
  sVar1 = (this->arguments_)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->arguments_)._M_ptr;
    lVar3 = 0;
    do {
      this_00 = *(Expression **)((long)ppEVar2 + lVar3);
      Expression::
      visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
                (this_00,this_00,visitor);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        visitExprsNoArgs(visitor);
        for (auto arg : arguments())
            arg->visit(visitor);
    }